

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_smart_pointers.cpp
# Opt level: O0

int main(void)

{
  CurrentAccount *this;
  ostream *poVar1;
  element_type *peVar2;
  element_type *ca;
  CurrentAccount *underlying_ptr;
  undefined1 local_38 [8];
  shared_ptr<CurrentAccount> smart_ptr;
  CurrentAccount *dumb_ptr;
  
  this = (CurrentAccount *)operator_new(0x10);
  CurrentAccount::CurrentAccount(this,100);
  (*(this->super_IBankAccount)._vptr_IBankAccount[2])(this,100);
  poVar1 = operator<<((ostream *)&std::cout,this);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (this != (CurrentAccount *)0x0) {
    (*(this->super_IBankAccount)._vptr_IBankAccount[1])();
  }
  std::make_shared<CurrentAccount,int>((int *)local_38);
  peVar2 = std::__shared_ptr_access<CurrentAccount,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<CurrentAccount,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_38);
  (*(peVar2->super_IBankAccount)._vptr_IBankAccount[2])(peVar2,100);
  peVar2 = std::__shared_ptr_access<CurrentAccount,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<CurrentAccount,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_38);
  poVar1 = operator<<((ostream *)&std::cout,peVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ca = std::__shared_ptr<CurrentAccount,_(__gnu_cxx::_Lock_policy)2>::get
                 ((__shared_ptr<CurrentAccount,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  poVar1 = operator<<((ostream *)&std::cout,ca);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<CurrentAccount>::~shared_ptr((shared_ptr<CurrentAccount> *)local_38);
  return 0;
}

Assistant:

int main()
{
	auto dumb_ptr{new CurrentAccount(100)};
	dumb_ptr->deposit(100);
	std::cout << *dumb_ptr << std::endl;
	delete dumb_ptr;

	auto smart_ptr{std::make_shared<CurrentAccount>(100)};
	smart_ptr->deposit(100);
	std::cout << *smart_ptr << std::endl;
	CurrentAccount* underlying_ptr{smart_ptr.get()};
	std::cout << *underlying_ptr << std::endl;

	return 0;
}